

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmMakefileTargetGeneratorObjectStrings::Feed
          (cmMakefileTargetGeneratorObjectStrings *this,string *obj)

{
  cmOutputConverter *this_00;
  string_view source;
  string local_58;
  string local_38;
  
  this_00 = this->OutputConverter;
  cmOutputConverter::MaybeRelativeToCurBinDir(&local_58,this_00,obj);
  source._M_str = local_58._M_dataplus._M_p;
  source._M_len = local_58._M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_(&local_38,this_00,source,RESPONSE);
  std::__cxx11::string::operator=((string *)&this->NextObject,(string *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((this->LengthLimit != 0xffffffffffffffff) &&
     (this->LengthLimit <
      (this->CurrentString)._M_string_length + (this->NextObject)._M_string_length + 1)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(this->Strings,&this->CurrentString);
    (this->CurrentString)._M_string_length = 0;
    *(this->CurrentString)._M_dataplus._M_p = '\0';
    this->Space = "";
  }
  std::__cxx11::string::append((char *)&this->CurrentString);
  this->Space = " ";
  std::__cxx11::string::_M_append
            ((char *)&this->CurrentString,(ulong)(this->NextObject)._M_dataplus._M_p);
  return;
}

Assistant:

void Feed(std::string const& obj)
  {
    // Construct the name of the next object.
    this->NextObject = this->OutputConverter->ConvertToOutputFormat(
      this->OutputConverter->MaybeRelativeToCurBinDir(obj),
      cmOutputConverter::RESPONSE);

    // Roll over to next string if the limit will be exceeded.
    if (this->LengthLimit != std::string::npos &&
        (this->CurrentString.length() + 1 + this->NextObject.length() >
         this->LengthLimit)) {
      this->Strings.push_back(this->CurrentString);
      this->CurrentString.clear();
      this->Space = "";
    }

    // Separate from previous object.
    this->CurrentString += this->Space;
    this->Space = " ";

    // Append this object.
    this->CurrentString += this->NextObject;
  }